

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x2x.cc
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_2019::DataTransform<unsigned_int,_long_double>::Run
          (DataTransform<unsigned_int,_long_double> *this,istream *input_stream)

{
  longdouble lVar1;
  NumericType NVar2;
  WarningType WVar3;
  ostream *poVar4;
  size_t *__idx;
  int iVar5;
  bool bVar6;
  longdouble in_ST0;
  longdouble lVar7;
  longdouble lVar8;
  longdouble lVar9;
  longdouble lVar10;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble in_ST7;
  allocator local_2ad;
  uint input_data;
  string *local_2a8;
  double local_2a0;
  double local_298;
  long local_290;
  long local_288;
  ulong local_280;
  ulong local_278;
  ulong local_270;
  long local_268;
  longdouble local_25c;
  string local_250;
  string word;
  char buffer [128];
  
  local_2a8 = &this->print_format_;
  iVar5 = 0;
  do {
    if (this->is_ascii_input_ == true) {
      word._M_dataplus._M_p = (pointer)&word.field_2;
      word._M_string_length = 0;
      word.field_2._M_local_buf[0] = '\0';
      std::operator>>(input_stream,(string *)&word);
      bVar6 = word._M_string_length == 0;
      if (!bVar6) {
        std::__cxx11::stold((longdouble *)&word,(string *)0x0,__idx);
        local_268 = (long)ROUND(in_ST0);
        input_data = (uint)local_268;
        in_ST0 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = in_ST4;
        in_ST4 = in_ST5;
        in_ST5 = in_ST6;
        in_ST6 = in_ST7;
      }
      std::__cxx11::string::~string((string *)&word);
      if (!bVar6) goto LAB_0012b4cc;
      if (bVar6) {
        if (bVar6) {
LAB_0012b7f5:
          bVar6 = true;
          if ((this->is_ascii_output_ == true) && (iVar5 % this->num_column_ != 0)) {
            std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
          }
        }
        else {
LAB_0012b817:
          bVar6 = false;
        }
        return bVar6;
      }
    }
    else {
      bVar6 = sptk::ReadStream<unsigned_int>(&input_data,input_stream);
      if (!bVar6) goto LAB_0012b7f5;
LAB_0012b4cc:
      local_270 = (ulong)input_data;
      lVar7 = (longdouble)local_270;
      lVar10 = this->minimum_value_;
      lVar1 = this->maximum_value_;
      if (lVar10 < lVar1) {
        NVar2 = this->input_numeric_type_;
        if (NVar2 == kFloatingPoint) {
          if ((lVar10 <= lVar7) && (lVar10 = lVar1, lVar7 <= lVar1)) {
LAB_0012b64b:
            bVar6 = false;
            goto LAB_0012b64f;
          }
        }
        else if (NVar2 == kUnsignedInteger) {
          lVar8 = (longdouble)9.223372e+18;
          lVar9 = (longdouble)0;
          if (lVar8 <= lVar10) {
            lVar9 = lVar8;
          }
          local_278 = (ulong)ROUND(lVar10 - lVar9);
          in_ST3 = in_ST2;
          in_ST4 = in_ST2;
          if (((ulong)(lVar8 <= lVar10) << 0x3f ^ local_278) <= local_270) {
            lVar9 = (longdouble)9.223372e+18;
            lVar10 = (longdouble)0;
            if (lVar9 <= lVar1) {
              lVar10 = lVar9;
            }
            local_280 = (ulong)ROUND(lVar1 - lVar10);
            bVar6 = ((ulong)(lVar9 <= lVar1) << 0x3f ^ local_280) < local_270;
            if (bVar6) {
              lVar7 = lVar1;
            }
            goto LAB_0012b64f;
          }
        }
        else {
          if (NVar2 != kSignedInteger) goto LAB_0012b64b;
          local_288 = (long)ROUND(lVar10);
          in_ST4 = in_ST3;
          if (local_288 <= (long)local_270) {
            local_290 = (long)ROUND(lVar1);
            bVar6 = local_290 < (long)local_270;
            if (bVar6) {
              lVar7 = lVar1;
            }
            goto LAB_0012b64f;
          }
        }
LAB_0012b690:
        if (this->warning_type_ != kIgnore) {
          local_25c = lVar10;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&word);
          poVar4 = (ostream *)std::ostream::operator<<((ostream *)&word,iVar5);
          std::operator<<(poVar4,"th data is over the range of output type");
          std::__cxx11::string::string((string *)&local_250,"x2x",&local_2ad);
          sptk::PrintErrorMessage(&local_250,(ostringstream *)&word);
          std::__cxx11::string::~string((string *)&local_250);
          WVar3 = this->warning_type_;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&word);
          lVar10 = local_25c;
          if (WVar3 == kExit) goto LAB_0012b817;
        }
      }
      else {
        bVar6 = false;
LAB_0012b64f:
        if ((bVar6) || (this->rounding_ == false)) {
          lVar10 = lVar7;
          if (bVar6) goto LAB_0012b690;
        }
        else if (local_270 == 0) {
          local_2a0 = (double)local_270 + -0.5;
          lVar10 = (longdouble)local_2a0;
        }
        else {
          local_298 = (double)local_270 + 0.5;
          lVar10 = (longdouble)local_298;
        }
      }
      if (this->is_ascii_output_ == true) {
        bVar6 = sptk::SnPrintf<long_double>(lVar10,local_2a8,0x80,buffer);
        if (!bVar6) goto LAB_0012b817;
        std::operator<<((ostream *)&std::cout,buffer);
        if ((iVar5 + 1) % this->num_column_ == 0) {
          std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
          in_ST5 = in_ST4;
          in_ST6 = in_ST4;
          in_ST7 = in_ST4;
        }
        else {
          std::operator<<((ostream *)&std::cout,"\t");
          in_ST5 = in_ST4;
          in_ST6 = in_ST4;
          in_ST7 = in_ST4;
        }
      }
      else {
        bVar6 = sptk::WriteStream<long_double>(lVar10,(ostream *)&std::cout);
        in_ST5 = in_ST4;
        in_ST6 = in_ST4;
        in_ST7 = in_ST4;
        if (!bVar6) goto LAB_0012b817;
      }
    }
    iVar5 = iVar5 + 1;
  } while( true );
}

Assistant:

bool Run(std::istream* input_stream) const override {
    char buffer[kBufferSize];
    int index(0);
    for (;; ++index) {
      // Read.
      T1 input_data;
      if (is_ascii_input_) {
        std::string word;
        *input_stream >> word;
        if (word.empty()) break;
        try {
          input_data = static_cast<T1>(std::stold(word));
        } catch (std::invalid_argument&) {
          return false;
        }
      } else {
        if (!sptk::ReadStream(&input_data, input_stream)) {
          break;
        }
      }

      // Convert.
      T2 output_data(static_cast<T2>(input_data));

      bool is_clipped(false);
      {
        // Clipping.
        if (minimum_value_ < maximum_value_) {
          if (kSignedInteger == input_numeric_type_) {
            if (static_cast<std::int64_t>(input_data) <
                static_cast<std::int64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::int64_t>(maximum_value_) <
                       static_cast<std::int64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kUnsignedInteger == input_numeric_type_) {
            if (static_cast<std::uint64_t>(input_data) <
                static_cast<std::uint64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::uint64_t>(maximum_value_) <
                       static_cast<std::uint64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kFloatingPoint == input_numeric_type_) {
            if (static_cast<long double>(input_data) <
                static_cast<long double>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<long double>(maximum_value_) <
                       static_cast<long double>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          }
        }

        // Rounding.
        if (rounding_ && !is_clipped) {
          if (0.0 < input_data) {
            output_data = static_cast<T2>(input_data + 0.5);
          } else {
            output_data = static_cast<T2>(input_data - 0.5);
          }
        }
      }

      if (is_clipped && kIgnore != warning_type_) {
        std::ostringstream error_message;
        error_message << index << "th data is over the range of output type";
        sptk::PrintErrorMessage("x2x", error_message);
        if (kExit == warning_type_) return false;
      }

      // Write output.
      if (is_ascii_output_) {
        if (!sptk::SnPrintf(output_data, print_format_, sizeof(buffer),
                            buffer)) {
          return false;
        }
        std::cout << buffer;
        if (0 == (index + 1) % num_column_) {
          std::cout << std::endl;
        } else {
          std::cout << "\t";
        }
      } else {
        if (!sptk::WriteStream(output_data, &std::cout)) {
          return false;
        }
      }
    }

    if (is_ascii_output_ && 0 != index % num_column_) {
      std::cout << std::endl;
    }

    return true;
  }